

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

bool __thiscall kj::anon_unknown_9::rmrf(anon_unknown_9 *this,int fd,StringPtr path)

{
  int iVar1;
  void *pvVar2;
  undefined4 in_register_00000034;
  Fault local_160;
  Fault f_3;
  SyscallResult local_144;
  SyscallResult _kjSyscallResult_2;
  Fault f_2;
  SyscallResult local_124;
  SyscallResult _kjSyscallResult_1;
  Fault f_1;
  SyscallResult local_fc;
  undefined1 local_f8 [4];
  SyscallResult _kjSyscallResult;
  int subdirFd;
  Fault local_e8;
  Fault f;
  undefined1 auStack_d8 [4];
  int error;
  StringPtr *local_d0;
  stat *local_c8;
  int local_bc;
  undefined1 local_b8 [4];
  int _kjSyscallError;
  stat stats;
  undefined1 auStack_20 [4];
  int fd_local;
  StringPtr path_local;
  
  _auStack_20 = (char *)CONCAT44(in_register_00000034,fd);
  path_local.content.ptr = path.content.ptr;
  stats.__glibc_reserved[2]._4_4_ = SUB84(this,0);
  _auStack_d8 = (int *)((long)stats.__glibc_reserved + 0x14);
  local_d0 = (StringPtr *)auStack_20;
  local_c8 = (stat *)local_b8;
  f.exception._4_4_ =
       kj::_::Debug::syscallError<kj::(anonymous_namespace)::rmrf(int,kj::StringPtr)::__0>
                 ((anon_class_24_3_e9b5c07f *)auStack_d8,false);
  local_bc = f.exception._4_4_;
  if (f.exception._4_4_ != 0) {
    if ((f.exception._4_4_ == 2) || (f.exception._4_4_ == 0x14)) {
      path_local.content.size_._7_1_ = 0;
    }
    else {
      kj::_::Debug::Fault::Fault<int,kj::StringPtr&>
                (&local_e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0xd6,f.exception._4_4_,"lstat(path)","path",(StringPtr *)auStack_20);
      path_local.content.size_._7_1_ = 0;
      kj::_::Debug::Fault::~Fault(&local_e8);
    }
    goto LAB_009a9351;
  }
  if (((uint)stats.st_nlink & 0xf000) == 0x4000) {
    f_1.exception = (Exception *)local_f8;
    local_fc = kj::_::Debug::syscall<kj::(anonymous_namespace)::rmrf(int,kj::StringPtr)::__1>
                         ((anon_class_24_3_be7885b9 *)&f_1,false);
    pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_fc);
    if (pvVar2 == (void *)0x0) {
      iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(&local_fc);
      kj::_::Debug::Fault::Fault
                ((Fault *)&stack0xfffffffffffffee0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0xdc,iVar1,
                 "subdirFd = openat( fd, path.cStr(), O_RDONLY | MAYBE_O_DIRECTORY | MAYBE_O_CLOEXEC | O_NOFOLLOW)"
                 ,"");
      path_local.content.size_._7_1_ = 0;
      kj::_::Debug::Fault::~Fault((Fault *)&stack0xfffffffffffffee0);
      goto LAB_009a9351;
    }
    rmrfChildrenAndClose((int)local_f8);
    f_2.exception = (Exception *)((long)stats.__glibc_reserved + 0x14);
    local_124 = kj::_::Debug::syscall<kj::(anonymous_namespace)::rmrf(int,kj::StringPtr)::__2>
                          ((anon_class_16_2_51542000 *)&f_2,false);
    pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_124);
    if (pvVar2 == (void *)0x0) {
      iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(&local_124);
      kj::_::Debug::Fault::Fault
                ((Fault *)&stack0xfffffffffffffec0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0xe0,iVar1,"unlinkat(fd, path.cStr(), AT_REMOVEDIR)","");
      path_local.content.size_._7_1_ = 0;
      kj::_::Debug::Fault::~Fault((Fault *)&stack0xfffffffffffffec0);
      goto LAB_009a9351;
    }
  }
  else {
    f_3.exception = (Exception *)((long)stats.__glibc_reserved + 0x14);
    local_144 = kj::_::Debug::syscall<kj::(anonymous_namespace)::rmrf(int,kj::StringPtr)::__3>
                          ((anon_class_16_2_51542000 *)&f_3,false);
    pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_144);
    if (pvVar2 == (void *)0x0) {
      iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(&local_144);
      kj::_::Debug::Fault::Fault
                (&local_160,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0xe2,iVar1,"unlinkat(fd, path.cStr(), 0)","");
      path_local.content.size_._7_1_ = 0;
      kj::_::Debug::Fault::~Fault(&local_160);
      goto LAB_009a9351;
    }
  }
  path_local.content.size_._7_1_ = 1;
LAB_009a9351:
  return (bool)(path_local.content.size_._7_1_ & 1);
}

Assistant:

static bool rmrf(int fd, StringPtr path) {
  struct stat stats;
  KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd, path.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
    case ENOENT:
    case ENOTDIR:
      // Doesn't exist.
      return false;
    default:
      KJ_FAIL_SYSCALL("lstat(path)", error, path) { return false; }
  }

  if (S_ISDIR(stats.st_mode)) {
    int subdirFd;
    KJ_SYSCALL(subdirFd = openat(
        fd, path.cStr(), O_RDONLY | MAYBE_O_DIRECTORY | MAYBE_O_CLOEXEC | O_NOFOLLOW)) {
      return false;
    }
    rmrfChildrenAndClose(subdirFd);
    KJ_SYSCALL(unlinkat(fd, path.cStr(), AT_REMOVEDIR)) { return false; }
  } else {
    KJ_SYSCALL(unlinkat(fd, path.cStr(), 0)) { return false; }
  }

  return true;
}